

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterCreateThread(SortSubtask *pTask,_func_void_ptr_void_ptr *xTask,void *pIn)

{
  int iVar1;
  void *pIn_local;
  _func_void_ptr_void_ptr *xTask_local;
  SortSubtask *pTask_local;
  
  iVar1 = sqlite3ThreadCreate(&pTask->pThread,xTask,pIn);
  return iVar1;
}

Assistant:

static int vdbeSorterCreateThread(
  SortSubtask *pTask,             /* Thread will use this task object */
  void *(*xTask)(void*),          /* Routine to run in a separate thread */
  void *pIn                       /* Argument passed into xTask() */
){
  assert( pTask->pThread==0 && pTask->bDone==0 );
  return sqlite3ThreadCreate(&pTask->pThread, xTask, pIn);
}